

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

bool __thiscall
vkb::PhysicalDevice::enable_extensions_if_present
          (PhysicalDevice *this,vector<const_char_*,_std::allocator<const_char_*>_> *extensions)

{
  pointer pbVar1;
  pointer ppcVar2;
  int iVar3;
  long lVar4;
  pointer ppcVar5;
  pointer pbVar6;
  pointer pbVar7;
  bool bVar8;
  allocator<char> local_69;
  PhysicalDevice *local_68;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppcVar5 = (extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_58 = (extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  bVar8 = ppcVar5 == local_58;
  local_68 = this;
  local_60 = extensions;
  do {
    if (bVar8) {
LAB_001340bc:
      ppcVar5 = (local_60->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppcVar2 = (local_60->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppcVar5 != ppcVar2) {
        local_68 = (PhysicalDevice *)&local_68->extensions_to_enable;
        do {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar5,&local_69)
          ;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_68,
                     &local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          ppcVar5 = ppcVar5 + 1;
        } while (ppcVar5 != ppcVar2);
      }
      return bVar8;
    }
    pbVar7 = (local_68->available_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (local_68->available_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar4 = (long)pbVar1 - (long)pbVar7 >> 7;
    if (0 < lVar4) {
      lVar4 = lVar4 + 1;
      do {
        iVar3 = std::__cxx11::string::compare((char *)pbVar7);
        pbVar6 = pbVar7;
        if (iVar3 == 0) goto LAB_00134095;
        iVar3 = std::__cxx11::string::compare((char *)(pbVar7 + 1));
        pbVar6 = pbVar7 + 1;
        if (iVar3 == 0) goto LAB_00134095;
        iVar3 = std::__cxx11::string::compare((char *)(pbVar7 + 2));
        pbVar6 = pbVar7 + 2;
        if (iVar3 == 0) goto LAB_00134095;
        iVar3 = std::__cxx11::string::compare((char *)(pbVar7 + 3));
        pbVar6 = pbVar7 + 3;
        if (iVar3 == 0) goto LAB_00134095;
        pbVar7 = pbVar7 + 4;
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    lVar4 = (long)pbVar1 - (long)pbVar7 >> 5;
    if (lVar4 == 1) {
LAB_0013407c:
      iVar3 = std::__cxx11::string::compare((char *)pbVar7);
      pbVar6 = pbVar1;
      if (iVar3 == 0) {
        pbVar6 = pbVar7;
      }
    }
    else if (lVar4 == 2) {
LAB_00134069:
      iVar3 = std::__cxx11::string::compare((char *)pbVar7);
      pbVar6 = pbVar7;
      if (iVar3 != 0) {
        pbVar7 = pbVar7 + 1;
        goto LAB_0013407c;
      }
    }
    else {
      pbVar6 = pbVar1;
      if ((lVar4 == 3) &&
         (iVar3 = std::__cxx11::string::compare((char *)pbVar7), pbVar6 = pbVar7, iVar3 != 0)) {
        pbVar7 = pbVar7 + 1;
        goto LAB_00134069;
      }
    }
LAB_00134095:
    if (pbVar6 == (local_68->available_extensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (bVar8 == false) {
        return false;
      }
      goto LAB_001340bc;
    }
    ppcVar5 = ppcVar5 + 1;
    bVar8 = ppcVar5 == local_58;
  } while( true );
}

Assistant:

bool PhysicalDevice::enable_extensions_if_present(const std::vector<const char*>& extensions) {
    for (const auto extension : extensions) {
        auto it = std::find_if(std::begin(available_extensions),
            std::end(available_extensions),
            [extension](std::string const& ext_name) { return ext_name == extension; });
        if (it == std::end(available_extensions)) return false;
    }
    for (const auto extension : extensions)
        extensions_to_enable.push_back(extension);
    return true;
}